

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsslsocket.cpp
# Opt level: O0

void QSslSocket::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  ulong written;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  AlertType in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QSslSocket *_t;
  undefined4 in_stack_fffffffffffffee8;
  SslMode in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  QSslSocketPrivate *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  SocketError error;
  QSslSocketPrivate *in_stack_ffffffffffffff10;
  QSslSocketPrivate *in_stack_ffffffffffffff20;
  QSslSocketPrivate *in_stack_ffffffffffffff30;
  QMetaType local_38;
  QMetaTypeInterface *local_30;
  QMetaType local_28;
  QMetaTypeInterface *local_20;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  error = (SocketError)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    written = (ulong)in_EDX;
    switch(written) {
    case 0:
      encrypted((QSslSocket *)0x3a8791);
      break;
    case 1:
      peerVerifyError((QSslSocket *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (QSslError *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      break;
    case 2:
      sslErrors((QSslSocket *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                (QList<QSslError> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      break;
    case 3:
      modeChanged((QSslSocket *)0x3a87ed,in_stack_fffffffffffffeec);
      break;
    case 4:
      encryptedBytesWritten
                ((QSslSocket *)0x3a880e,
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      break;
    case 5:
      preSharedKeyAuthenticationRequired
                ((QSslSocket *)0x3a882f,
                 (QSslPreSharedKeyAuthenticator *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      break;
    case 6:
      newSessionTicketReceived((QSslSocket *)0x3a8841);
      break;
    case 7:
      alertSent((QSslSocket *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),Warning,
                in_EDX,(QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      break;
    case 8:
      alertReceived((QSslSocket *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    Warning,in_EDX,
                    (QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      break;
    case 9:
      handshakeInterruptedOnError
                ((QSslSocket *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (QSslError *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      break;
    case 10:
      startClientEncryption((QSslSocket *)in_stack_ffffffffffffff00);
      break;
    case 0xb:
      startServerEncryption((QSslSocket *)in_stack_ffffffffffffff00);
      break;
    case 0xc:
      ignoreSslErrors((QSslSocket *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case 0xd:
      d_func((QSslSocket *)0x3a891b);
      QSslSocketPrivate::_q_connectedSlot(in_stack_ffffffffffffff20);
      break;
    case 0xe:
      d_func((QSslSocket *)0x3a8935);
      QSslSocketPrivate::_q_hostFoundSlot
                ((QSslSocketPrivate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
      ;
      break;
    case 0xf:
      d_func((QSslSocket *)0x3a894f);
      QSslSocketPrivate::_q_disconnectedSlot(in_stack_ffffffffffffff30);
      break;
    case 0x10:
      d_func((QSslSocket *)0x3a8969);
      QSslSocketPrivate::_q_stateChangedSlot
                ((QSslSocketPrivate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffeec);
      break;
    case 0x11:
      d_func((QSslSocket *)0x3a8991);
      QSslSocketPrivate::_q_errorSlot(in_stack_ffffffffffffff10,error);
      break;
    case 0x12:
      d_func((QSslSocket *)0x3a89b9);
      QSslSocketPrivate::_q_readyReadSlot
                ((QSslSocketPrivate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
      ;
      break;
    case 0x13:
      d_func((QSslSocket *)0x3a89d3);
      QSslSocketPrivate::_q_channelReadyReadSlot(in_stack_ffffffffffffff00,(int)(written >> 0x20));
      break;
    case 0x14:
      d_func((QSslSocket *)0x3a89fb);
      QSslSocketPrivate::_q_bytesWrittenSlot(in_stack_ffffffffffffff00,written);
      break;
    case 0x15:
      d_func((QSslSocket *)0x3a8a24);
      QSslSocketPrivate::_q_channelBytesWrittenSlot
                (in_stack_ffffffffffffff00,(int)(written >> 0x20),
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case 0x16:
      d_func((QSslSocket *)0x3a8a58);
      QSslSocketPrivate::_q_readChannelFinishedSlot
                ((QSslSocketPrivate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
      ;
      break;
    case 0x17:
      d_func((QSslSocket *)0x3a8a6f);
      QSslSocketPrivate::_q_flushWriteBuffer
                ((QSslSocketPrivate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
      ;
      break;
    case 0x18:
      d_func((QSslSocket *)0x3a8a86);
      QSslSocketPrivate::_q_flushReadBuffer
                ((QSslSocketPrivate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
      ;
      break;
    case 0x19:
      d_func((QSslSocket *)0x3a8a9d);
      QSslSocketPrivate::_q_resumeImplementation
                ((QSslSocketPrivate *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
      ;
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 2) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_20 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        **(undefined8 **)in_RCX = local_20;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else if (in_EDX == 0x10) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_30 = (QMetaTypeInterface *)QMetaType::fromType<QAbstractSocket::SocketState>();
        **(undefined8 **)in_RCX = local_30;
      }
      else {
        memset(&local_28,0,8);
        QMetaType::QMetaType(&local_28);
        **(undefined8 **)in_RCX = local_28.d_ptr;
      }
    }
    else if (in_EDX == 0x11) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QAbstractSocket::SocketError>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)in_RCX = local_38.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if ((((((in_ESI == 5) &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)()>(in_RCX,(void **)encrypted,0,0),
         !bVar1)) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QSslError_const&)>
                           (in_RCX,(void **)peerVerifyError,0,1), !bVar1)) &&
       ((bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QList<QSslError>const&)>
                           (in_RCX,(void **)sslErrors,0,2), !bVar1 &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QSslSocket::SslMode)>
                           (in_RCX,(void **)modeChanged,0,3), !bVar1)))) &&
      ((bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(long_long)>
                          (in_RCX,(void **)encryptedBytesWritten,0,4), !bVar1 &&
       ((bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QSslPreSharedKeyAuthenticator*)>
                           (in_RCX,(void **)preSharedKeyAuthenticationRequired,0,5), !bVar1 &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)()>
                           (in_RCX,(void **)newSessionTicketReceived,0,6), !bVar1)))))) &&
     ((bVar1 = QtMocHelpers::
               indexOfMethod<void(QSslSocket::*)(QSsl::AlertLevel,QSsl::AlertType,QString_const&)>
                         (in_RCX,(void **)alertSent,0,7), !bVar1 &&
      (bVar1 = QtMocHelpers::
               indexOfMethod<void(QSslSocket::*)(QSsl::AlertLevel,QSsl::AlertType,QString_const&)>
                         (in_RCX,(void **)alertReceived,0,8), !bVar1)))) {
    QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QSslError_const&)>
              (in_RCX,(void **)handshakeInterruptedOnError,0,9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocket::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSslSocket *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->encrypted(); break;
        case 1: _t->peerVerifyError((*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[1]))); break;
        case 2: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 3: _t->modeChanged((*reinterpret_cast< std::add_pointer_t<QSslSocket::SslMode>>(_a[1]))); break;
        case 4: _t->encryptedBytesWritten((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 6: _t->newSessionTicketReceived(); break;
        case 7: _t->alertSent((*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 8: _t->alertReceived((*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 9: _t->handshakeInterruptedOnError((*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[1]))); break;
        case 10: _t->startClientEncryption(); break;
        case 11: _t->startServerEncryption(); break;
        case 12: _t->ignoreSslErrors(); break;
        case 13: _t->d_func()->_q_connectedSlot(); break;
        case 14: _t->d_func()->_q_hostFoundSlot(); break;
        case 15: _t->d_func()->_q_disconnectedSlot(); break;
        case 16: _t->d_func()->_q_stateChangedSlot((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketState>>(_a[1]))); break;
        case 17: _t->d_func()->_q_errorSlot((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 18: _t->d_func()->_q_readyReadSlot(); break;
        case 19: _t->d_func()->_q_channelReadyReadSlot((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 20: _t->d_func()->_q_bytesWrittenSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 21: _t->d_func()->_q_channelBytesWrittenSlot((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 22: _t->d_func()->_q_readChannelFinishedSlot(); break;
        case 23: _t->d_func()->_q_flushWriteBuffer(); break;
        case 24: _t->d_func()->_q_flushReadBuffer(); break;
        case 25: _t->d_func()->_q_resumeImplementation(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 16:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketState >(); break;
            }
            break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)()>(_a, &QSslSocket::encrypted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QSslError & )>(_a, &QSslSocket::peerVerifyError, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QList<QSslError> & )>(_a, &QSslSocket::sslErrors, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSslSocket::SslMode )>(_a, &QSslSocket::modeChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(qint64 )>(_a, &QSslSocket::encryptedBytesWritten, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QSslSocket::preSharedKeyAuthenticationRequired, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)()>(_a, &QSslSocket::newSessionTicketReceived, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslSocket::alertSent, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslSocket::alertReceived, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QSslError & )>(_a, &QSslSocket::handshakeInterruptedOnError, 9))
            return;
    }
}